

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86Disassembler.c
# Opt level: O2

_Bool X86_getInstruction(csh ud,uint8_t *code,size_t code_len,MCInst *instr,uint16_t *size,
                        uint64_t address,void *_info)

{
  cs_detail *pcVar1;
  cs_insn *pcVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  x86_reg xVar8;
  ulong uVar9;
  ulong uVar10;
  uint8_t uVar11;
  undefined *puVar12;
  Reg reg;
  DisassemblerMode mode;
  long lVar13;
  OperandSpecifier *pOVar14;
  bool bVar15;
  InternalInstruction insn;
  reader_info info;
  
  info.code = code;
  info.size = code_len;
  info.offset = address;
  memset(&insn,0,0x98);
  pcVar1 = instr->flat_insn->detail;
  if (pcVar1 != (cs_detail *)0x0) {
    (pcVar1->field_6).x86.op_count = '\0';
    (instr->flat_insn->detail->field_6).x86.sse_cc = X86_SSE_CC_INVALID;
    (instr->flat_insn->detail->field_6).x86.avx_cc = X86_AVX_CC_INVALID;
    (instr->flat_insn->detail->field_6).x86.avx_sae = false;
    (instr->flat_insn->detail->field_6).x86.avx_rm = X86_AVX_RM_INVALID;
    (instr->flat_insn->detail->field_6).arm64.cc = ARM64_CC_INVALID;
    (instr->flat_insn->detail->field_6).arm.vector_size = 0;
    memset((void *)((long)&instr->flat_insn->detail->field_6 + 0x30),0,0x180);
  }
  mode = ((*(uint *)(ud + 4) & 4) == 0) + MODE_32BIT;
  if ((*(uint *)(ud + 4) & 2) != 0) {
    mode = MODE_16BIT;
  }
  iVar4 = decodeInstruction(&insn,reader,&info,address,mode);
  if (iVar4 == 0) {
    *size = (uint16_t)insn.length;
    if (insn.spec != (InstructionSpecifier *)0x0) {
      MCInst_setOpcode(instr,(uint)insn.instructionID);
      if (insn.xAcquireRelease == true) {
        uVar5 = MCInst_getOpcode(instr);
        uVar6 = 0x186f;
        if (uVar5 != 0x943) {
          uVar5 = MCInst_getOpcode(instr);
          uVar6 = 0x1828;
          if (uVar5 != 0x93b) goto LAB_0019e170;
        }
        MCInst_setOpcode(instr,uVar6);
      }
LAB_0019e170:
      insn.numImmediatesTranslated = '\0';
      lVar13 = 0;
LAB_0019e182:
      if (lVar13 == 5) {
        instr->imm_size = insn.immSize;
        if (*(int *)(ud + 0x68) == 0) {
          instr->x86_prefix[0] = insn.prefix0;
          instr->x86_prefix[1] = insn.prefix1;
          instr->x86_prefix[2] = insn.prefix2;
          instr->x86_prefix[3] = insn.prefix3;
        }
        else {
          pcVar2 = instr->flat_insn;
          instr->x86_prefix[0] = insn.prefix0;
          instr->x86_prefix[1] = insn.prefix1;
          instr->x86_prefix[2] = insn.prefix2;
          instr->x86_prefix[3] = insn.prefix3;
          if (insn.vectorExtensionType == TYPE_NO_VEX_XOP) {
            if (insn.twoByteEscape == '\0') {
              (pcVar2->detail->field_6).x86.opcode[0] = insn.opcode;
            }
            else {
              (pcVar2->detail->field_6).x86.opcode[0] = insn.twoByteEscape;
              if (insn.threeByteEscape == '\0') {
                (pcVar2->detail->field_6).x86.opcode[1] = insn.opcode;
              }
              else {
                (pcVar2->detail->field_6).x86.opcode[1] = insn.threeByteEscape;
                (pcVar2->detail->field_6).x86.opcode[2] = insn.opcode;
              }
            }
          }
          else {
            (pcVar2->detail->field_6).arm.vector_size = (int)insn.vectorExtensionPrefix;
          }
          (pcVar2->detail->field_6).x86.rex = insn.rexPrefix;
          (pcVar2->detail->field_6).x86.addr_size = insn.addressSize;
          (pcVar2->detail->field_6).x86.modrm = insn.orgModRM;
          (pcVar2->detail->field_6).x86.sib = insn.sib;
          (pcVar2->detail->field_6).x86.disp = insn.displacement;
          xVar8 = x86_map_sib_index(insn.sibIndex);
          (pcVar2->detail->field_6).x86.sib_index = xVar8;
          (pcVar2->detail->field_6).x86.sib_scale = insn.sibScale;
          xVar8 = x86_map_sib_base(insn.sibBase);
          (pcVar2->detail->field_6).x86.sib_base = xVar8;
        }
        return true;
      }
      uVar11 = insn.operands[lVar13].encoding;
      if (uVar11 != '\0') {
        pOVar14 = insn.operands + lVar13;
LAB_0019e1aa:
        switch(uVar11) {
        case '\x01':
          goto switchD_0019e1c0_caseD_1;
        case '\x02':
        case '\x03':
        case '\x04':
        case '\x05':
        case '\x06':
        case '\a':
        case '\b':
          switch(pOVar14->type) {
          case '\b':
          case '\t':
          case '\n':
          case '\v':
          case '9':
          case ':':
          case ';':
          case '<':
          case '=':
          case '>':
          case '?':
          case '@':
          case 'A':
          case 'B':
          case 'E':
          case 'F':
          case 'K':
          case 'L':
          case 'N':
            if (insn.eaBase == EA_BASE_sib) {
              return false;
            }
            if (insn.eaBase == EA_BASE_sib64) {
              return false;
            }
            if (0xd2 < insn.eaBase - EA_REG_AL) {
              return false;
            }
            uVar5 = *(uint *)(&DAT_001e9e7c + (ulong)(insn.eaBase - EA_REG_AL) * 4);
            break;
          default:
            return false;
          case '\x16':
          case '\x17':
          case '\x18':
          case '\x19':
          case '\x1a':
          case '\x1b':
          case '\x1c':
          case '\x1d':
          case '\x1e':
          case '\x1f':
          case ' ':
          case '2':
          case '3':
          case '4':
          case '5':
          case '6':
          case '7':
          case 'M':
          case 'V':
            goto code_r0x0019e352;
          }
        case '\t':
          reg = insn.vvvv;
          goto LAB_0019e334;
        case '\n':
          if ((insn.writemask & (MODRM_REG_DR6|MODRM_REG_RSP)) != MODRM_REG_AL) {
            return false;
          }
          uVar5 = insn.writemask + MODRM_REG_XMM6 & 0x5f;
          break;
        default:
          goto switchD_0019e1f1_caseD_c;
        case '\x11':
        case '\x12':
        case '\x13':
        case '\x14':
        case '\x1a':
        case '\x1b':
          uVar9 = (ulong)insn.numImmediatesTranslated;
          insn.numImmediatesTranslated = insn.numImmediatesTranslated + '\x01';
          uVar9 = insn.immediates[uVar9];
          bVar3 = pOVar14->type;
          if (bVar3 - 0xc < 4) {
LAB_0019e259:
            uVar5 = MCInst_getOpcode(instr);
            uVar11 = pOVar14->encoding;
            if (uVar11 == '\x13') {
              uVar10 = uVar9 | 0xffffffff00000000;
              bVar15 = (int)uVar9 < 0;
LAB_0019e565:
              if (bVar15) {
                uVar9 = uVar10;
              }
            }
            else {
              if (uVar11 == '\x12') {
                uVar10 = uVar9 | 0xffffffffffff0000;
                bVar15 = (short)uVar9 < 0;
                goto LAB_0019e565;
              }
              if ((((((((uVar11 == '\x11') && ((uVar5 & 0xfffffffb) - 0xbe3 < 0xfffffffe)) &&
                      (2 < uVar5 - 0xcf9)) && ((uVar5 != 0xfc && (uVar5 != 0xfe)))) &&
                    ((uVar5 != 0x2d8 && ((uVar5 != 0x2da && (uVar5 != 0x390)))))) &&
                   (uVar5 != 0x395)) && (((uVar5 != 0x6df && (uVar5 != 0x79d)) && (uVar5 != 0xf1b)))
                  ) && ((uVar5 != 0x1181 && (uVar5 != 0x1268)))) {
                uVar10 = uVar9 | 0xffffffffffffff00;
                bVar15 = (char)uVar9 < '\0';
                goto LAB_0019e565;
              }
            }
LAB_0019e569:
            if (bVar3 - 0x3d < 3) {
              uVar5 = ((uint)uVar9 >> 4) + 0x72;
            }
            else {
              if (bVar3 - 3 < 2) goto LAB_0019e5b1;
              if (bVar3 == 1) {
LAB_0019e630:
                uVar10 = uVar9 | 0xffffffffffffff00;
                bVar15 = (char)uVar9 < '\0';
                goto LAB_0019e680;
              }
              if (bVar3 == 0x40) {
                uVar5 = ((uint)uVar9 >> 4) + 0x92;
              }
              else {
                if (bVar3 != 0x41) goto LAB_0019e684;
                uVar5 = ((uint)(uVar9 >> 4) & 0xfffffff) + 0xb2;
              }
            }
          }
          else {
            if (bVar3 == 0x10) {
              if (7 < uVar9) {
                uVar6 = MCInst_getOpcode(instr);
                uVar6 = uVar6 - 0x226;
                uVar5 = 0;
                if (uVar6 < 0x12) {
                  puVar12 = &DAT_001ea44c;
LAB_0019e623:
                  uVar5 = *(uint *)(puVar12 + (ulong)uVar6 * 4);
                }
LAB_0019e626:
                MCInst_setOpcode(instr,uVar5);
              }
            }
            else {
              if (bVar3 == 0x4f) goto LAB_0019e259;
              if (bVar3 != 0x50) {
                if ((0x1f < uVar9) && (bVar3 == 0x11)) {
                  uVar6 = MCInst_getOpcode(instr);
                  uVar6 = uVar6 - 0xc01;
                  uVar5 = 0;
                  if (uVar6 < 0x29) {
                    puVar12 = &DAT_001ea494;
                    goto LAB_0019e623;
                  }
                  goto LAB_0019e626;
                }
                goto LAB_0019e569;
              }
              if (insn.displacementSize != '\x04') {
                if (insn.displacementSize != '\x02') {
                  if (insn.displacementSize != '\x01') goto LAB_0019e684;
                  goto LAB_0019e630;
                }
                uVar10 = uVar9 | 0xffffffffffff0000;
                bVar15 = (short)uVar9 < 0;
                goto LAB_0019e680;
              }
LAB_0019e5b1:
              uVar10 = uVar9 | 0xffffffff00000000;
              bVar15 = (int)uVar9 < 0;
LAB_0019e680:
              if (bVar15) {
                uVar9 = uVar10;
              }
            }
LAB_0019e684:
            MCOperand_CreateImm0(instr,uVar9);
            if (3 < (byte)(bVar3 - 0x2d)) goto LAB_0019e89d;
            uVar5 = (uint)""[insn.segmentOverride];
          }
          break;
        case '\x15':
        case '\x16':
        case '\x17':
        case '\x18':
        case '\x1c':
          reg = insn.opcodeRegister;
          goto LAB_0019e334;
        case '\x19':
          uVar5 = (insn.modRM & 7) + 0x6a;
          break;
        case '\x1d':
          goto switchD_0019e1c0_caseD_1d;
        case '\x1e':
          bVar3 = insn.isPrefix67;
          if (insn.mode == MODE_32BIT) {
LAB_0019e64d:
            uVar5 = (uint)bVar3 * 0x10 + 0x1d;
          }
          else {
            if (insn.mode != MODE_64BIT) {
              bVar3 = insn.isPrefix67 ^ 1;
              goto LAB_0019e64d;
            }
            uVar5 = 0x2b;
            if (insn.isPrefix67 != false) {
              uVar5 = 0x1d;
            }
          }
          MCOperand_CreateReg0(instr,uVar5);
          goto LAB_0019e886;
        case '\x1f':
          if (insn.mode == MODE_32BIT) {
            bVar3 = insn.isPrefix67 ^ 1;
          }
          else {
            bVar3 = insn.isPrefix67;
            if (insn.mode == MODE_64BIT) {
              uVar5 = (uint)(insn.isPrefix67 ^ 1) * 0x10 + 0x17;
              break;
            }
          }
          uVar5 = (uint)bVar3 + (uint)bVar3 * 8 + 0xe;
        }
        goto LAB_0019e898;
      }
      goto LAB_0019e89d;
    }
  }
  else {
    *size = (short)insn.readerCursor - (short)address;
  }
switchD_0019e1f1_caseD_c:
  return false;
switchD_0019e1c0_caseD_1d:
  pOVar14 = insn.operands + ((ulong)pOVar14->type - 0x51);
  uVar11 = pOVar14->encoding;
  goto LAB_0019e1aa;
code_r0x0019e352:
  uVar9 = 1;
  uVar5 = 0x2d;
  switch(insn.eaBase) {
  case EA_BASE_NONE:
    if (insn.eaDisplacement == EA_DISP_NONE) {
      return false;
    }
    if (insn.mode == MODE_64BIT) {
      if (insn.prefix3 == 'g') {
        uVar5 = 0x1a;
      }
      else {
        uVar5 = 0x29;
      }
      break;
    }
    uVar5 = 0;
    uVar6 = 0;
    goto LAB_0019e7d0;
  case EA_BASE_BX_SI:
    uVar6 = 8;
    goto LAB_0019e7d0;
  case EA_BASE_BX_DI:
    uVar5 = 8;
    goto LAB_0019e766;
  case EA_BASE_BP_SI:
    uVar6 = 6;
LAB_0019e7d0:
    MCOperand_CreateReg0(instr,uVar6);
    goto LAB_0019e861;
  case EA_BASE_BP_DI:
    uVar5 = 6;
LAB_0019e766:
    MCOperand_CreateReg0(instr,uVar5);
    uVar5 = 0xe;
    goto LAB_0019e861;
  case EA_BASE_SI:
    uVar5 = 0x2d;
    break;
  case EA_BASE_DI:
    uVar5 = 0xe;
    break;
  case EA_BASE_BP:
    uVar5 = 6;
    break;
  case EA_BASE_BX:
    uVar5 = 8;
    break;
  case EA_BASE_R8W:
    uVar5 = 0xe2;
    break;
  case EA_BASE_R9W:
    uVar5 = 0xe3;
    break;
  case EA_BASE_R10W:
    uVar5 = 0xe4;
    break;
  case EA_BASE_R11W:
    uVar5 = 0xe5;
    break;
  case EA_BASE_R12W:
    uVar5 = 0xe6;
    break;
  case EA_BASE_R13W:
    uVar5 = 0xe7;
    break;
  case EA_BASE_R14W:
    uVar5 = 0xe8;
    break;
  case EA_BASE_R15W:
    uVar5 = 0xe9;
    break;
  case EA_BASE_EAX:
    uVar5 = 0x13;
    break;
  case EA_BASE_ECX:
    uVar5 = 0x16;
    break;
  case EA_BASE_EDX:
    uVar5 = 0x18;
    break;
  case EA_BASE_EBX:
    uVar5 = 0x15;
    break;
  case EA_BASE_sib:
  case EA_BASE_sib64:
    if (0x20 < (ulong)insn.sibBase) {
      return false;
    }
    MCOperand_CreateReg0(instr,*(uint *)(&DAT_001ea1c8 + (ulong)insn.sibBase * 4));
    uVar5 = MCInst_getOpcode(instr);
    if (((uVar5 - 0xeea < 0x14) && ((0xfc03fU >> (uVar5 - 0xeea & 0x1f) & 1) != 0)) ||
       (uVar5 - 0x13e2 < 0xc)) {
      iVar4 = 0x71;
      if (((0xe < uVar5 - 0xeee) || ((0x4801U >> (uVar5 - 0xeee & 0x1f) & 1) == 0)) &&
         ((9 < uVar5 - 0x13e3 || ((0x241U >> (uVar5 - 0x13e3 & 0x1f) & 1) == 0)))) {
        iVar4 = (uint)(((uVar5 == 0x13e8 || uVar5 == 0x13eb) || (uVar5 & 0xfffffffb) == 0x13e2) ||
                      ((uVar5 == 0xef8 || uVar5 == 0xeed) || (uVar5 & 0xffffffef) == 0xeeb)) * 0x20
                + 0x31;
      }
      iVar7 = 4;
      if (insn.sibIndex != SIB_INDEX_NONE) {
        iVar7 = (uint)(insn.addressSize != '\b') * 0x10 + insn.sibIndex + -0x21;
      }
      insn.sibIndex = iVar7 + iVar4;
    }
    if (insn.sibIndex == SIB_INDEX_NONE) {
      uVar5 = 0;
    }
    else {
      if (0x7f < insn.sibIndex - SIB_INDEX_EAX) {
        return false;
      }
      uVar5 = *(uint *)(&DAT_001ea24c + (ulong)(insn.sibIndex - SIB_INDEX_EAX) * 4);
    }
    uVar9 = (ulong)insn.sibScale;
    goto LAB_0019e861;
  case EA_BASE_EBP:
    uVar5 = 0x14;
    break;
  case EA_BASE_ESI:
    uVar5 = 0x1d;
    break;
  case EA_BASE_EDI:
    uVar5 = 0x17;
    break;
  case EA_BASE_R8D:
    uVar5 = 0xda;
    break;
  case EA_BASE_R9D:
    uVar5 = 0xdb;
    break;
  case EA_BASE_R10D:
    uVar5 = 0xdc;
    break;
  case EA_BASE_R11D:
    uVar5 = 0xdd;
    break;
  case EA_BASE_R12D:
    uVar5 = 0xde;
    break;
  case EA_BASE_R13D:
    uVar5 = 0xdf;
    break;
  case EA_BASE_R14D:
    uVar5 = 0xe0;
    break;
  case EA_BASE_R15D:
    uVar5 = 0xe1;
    break;
  case EA_BASE_RAX:
    uVar5 = 0x23;
    break;
  case EA_BASE_RCX:
    uVar5 = 0x26;
    break;
  case EA_BASE_RDX:
    uVar5 = 0x28;
    break;
  case EA_BASE_RBX:
    uVar5 = 0x25;
    break;
  case EA_BASE_RBP:
    uVar5 = 0x24;
    break;
  case EA_BASE_RSI:
    uVar5 = 0x2b;
    break;
  case EA_BASE_RDI:
    uVar5 = 0x27;
    break;
  case EA_BASE_R8:
    uVar5 = 0x62;
    break;
  case EA_BASE_R9:
    uVar5 = 99;
    break;
  case EA_BASE_R10:
    uVar5 = 100;
    break;
  case EA_BASE_R11:
    uVar5 = 0x65;
    break;
  case EA_BASE_R12:
    uVar5 = 0x66;
    break;
  case EA_BASE_R13:
    uVar5 = 0x67;
    break;
  case EA_BASE_R14:
    uVar5 = 0x68;
    break;
  case EA_BASE_R15:
    uVar5 = 0x69;
    break;
  default:
    goto switchD_0019e1f1_caseD_c;
  }
  MCOperand_CreateReg0(instr,uVar5);
  uVar5 = 0;
LAB_0019e861:
  MCOperand_CreateImm0(instr,uVar9);
  MCOperand_CreateReg0(instr,uVar5);
  MCOperand_CreateImm0(instr,(long)insn.displacement);
LAB_0019e886:
  uVar5 = (uint)""[insn.segmentOverride];
LAB_0019e898:
  MCOperand_CreateReg0(instr,uVar5);
  goto LAB_0019e89d;
switchD_0019e1c0_caseD_1:
  reg = insn.reg;
LAB_0019e334:
  translateRegister(instr,reg);
LAB_0019e89d:
  lVar13 = lVar13 + 1;
  goto LAB_0019e182;
}

Assistant:

bool X86_getInstruction(csh ud, const uint8_t *code, size_t code_len,
		MCInst *instr, uint16_t *size, uint64_t address, void *_info)
{
	cs_struct *handle = (cs_struct *)(uintptr_t)ud;
	InternalInstruction insn;
	struct reader_info info;
	int ret;
	bool result;

	info.code = code;
	info.size = code_len;
	info.offset = address;

	memset(&insn, 0, offsetof(InternalInstruction, reader));

	if (instr->flat_insn->detail) {
		instr->flat_insn->detail->x86.op_count = 0;
		instr->flat_insn->detail->x86.sse_cc = X86_SSE_CC_INVALID;
		instr->flat_insn->detail->x86.avx_cc = X86_AVX_CC_INVALID;
		instr->flat_insn->detail->x86.avx_sae = false;
		instr->flat_insn->detail->x86.avx_rm = X86_AVX_RM_INVALID;

		memset(instr->flat_insn->detail->x86.prefix, 0, sizeof(instr->flat_insn->detail->x86.prefix));
		memset(instr->flat_insn->detail->x86.opcode, 0, sizeof(instr->flat_insn->detail->x86.opcode));
		memset(instr->flat_insn->detail->x86.operands, 0, sizeof(instr->flat_insn->detail->x86.operands));
	}

	if (handle->mode & CS_MODE_16)
		ret = decodeInstruction(&insn,
				reader, &info,
				address,
				MODE_16BIT);
	else if (handle->mode & CS_MODE_32)
		ret = decodeInstruction(&insn,
				reader, &info,
				address,
				MODE_32BIT);
	else
		ret = decodeInstruction(&insn,
				reader, &info,
				address,
				MODE_64BIT);

	if (ret) {
		*size = (uint16_t)(insn.readerCursor - address);

		return false;
	} else {
		*size = (uint16_t)insn.length;

		result = (!translateInstruction(instr, &insn)) ?  true : false;
		if (result) {
			instr->imm_size = insn.immSize;
			if (handle->detail) {
				update_pub_insn(instr->flat_insn, &insn, instr->x86_prefix);
			} else {
				// still copy all prefixes
				instr->x86_prefix[0] = insn.prefix0;
				instr->x86_prefix[1] = insn.prefix1;
				instr->x86_prefix[2] = insn.prefix2;
				instr->x86_prefix[3] = insn.prefix3;
			}
		}

		return result;
	}
}